

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_io_task_perform(void *uuid_,void *args_)

{
  fio_defer_task_s task;
  fio_protocol_s *pr_00;
  int *piVar1;
  fio_protocol_s *pr;
  intptr_t uuid;
  fio_defer_iotask_args_s *args;
  void *args__local;
  void *uuid__local;
  
  pr_00 = fio_protocol_try_lock((intptr_t)uuid_,*args_);
  if (pr_00 == (fio_protocol_s *)0x0) {
    piVar1 = __errno_location();
    if (*piVar1 == 9) {
      if (*(long *)((long)args_ + 0x18) != 0) {
        (**(code **)((long)args_ + 0x18))(uuid_,*(undefined8 *)((long)args_ + 0x10));
      }
      fio_free(args_);
    }
    else {
      task.arg1 = uuid_;
      task.func = fio_io_task_perform;
      task.arg2 = args_;
      fio_defer_push_task_fn(task,&task_queue_normal);
      fio_defer_thread_signal();
    }
  }
  else {
    (**(code **)((long)args_ + 8))(uuid_,pr_00,*(undefined8 *)((long)args_ + 0x10));
    fio_protocol_unlock(pr_00,*args_);
    fio_free(args_);
  }
  return;
}

Assistant:

static void fio_io_task_perform(void *uuid_, void *args_) {
  fio_defer_iotask_args_s *args = args_;
  intptr_t uuid = (intptr_t)uuid_;
  fio_protocol_s *pr = fio_protocol_try_lock(uuid, args->type);
  if (!pr)
    goto postpone;
  args->task(uuid, pr, args->udata);
  fio_protocol_unlock(pr, args->type);
  fio_free(args);
  return;
postpone:
  if (errno == EBADF) {
    if (args->fallback)
      args->fallback(uuid, args->udata);
    fio_free(args);
    return;
  }
  fio_defer_push_task(fio_io_task_perform, uuid_, args_);
}